

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::getActualMaximum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int endValue;
  Calendar *pCVar5;
  undefined4 extraout_var_00;
  Calendar *cal_1;
  Calendar *cal;
  int32_t result;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  undefined4 extraout_var;
  
  if (field == UCAL_DATE) {
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      return 0;
    }
    iVar4 = (*(this->super_UObject)._vptr_UObject[3])();
    pCVar5 = (Calendar *)CONCAT44(extraout_var,iVar4);
    if (pCVar5 == (Calendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    setLenient(pCVar5,'\x01');
    (*(pCVar5->super_UObject)._vptr_UObject[0x1e])(pCVar5,5,0,status);
    uVar3 = get(pCVar5,UCAL_EXTENDED_YEAR,status);
    uVar2 = get(pCVar5,UCAL_MONTH,status);
    cal._4_4_ = (*(this->super_UObject)._vptr_UObject[0x22])(this,(ulong)uVar3,(ulong)uVar2);
    if (pCVar5 != (Calendar *)0x0) {
      (*(pCVar5->super_UObject)._vptr_UObject[1])();
    }
  }
  else if (field == UCAL_DAY_OF_YEAR) {
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      return 0;
    }
    iVar4 = (*(this->super_UObject)._vptr_UObject[3])();
    pCVar5 = (Calendar *)CONCAT44(extraout_var_00,iVar4);
    if (pCVar5 == (Calendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    setLenient(pCVar5,'\x01');
    (*(pCVar5->super_UObject)._vptr_UObject[0x1e])(pCVar5,6,0,status);
    uVar3 = get(pCVar5,UCAL_EXTENDED_YEAR,status);
    cal._4_4_ = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar3);
    if (pCVar5 != (Calendar *)0x0) {
      (*(pCVar5->super_UObject)._vptr_UObject[1])();
    }
  }
  else if ((((field == UCAL_DAY_OF_WEEK) || (field - UCAL_AM_PM < 8)) || (field == UCAL_DOW_LOCAL))
          || (field - UCAL_JULIAN_DAY < 2)) {
    cal._4_4_ = (*(this->super_UObject)._vptr_UObject[0x10])(this,(ulong)field);
  }
  else {
    iVar4 = (*(this->super_UObject)._vptr_UObject[0x14])(this,(ulong)field);
    endValue = (*(this->super_UObject)._vptr_UObject[0x10])(this,(ulong)field);
    cal._4_4_ = getActualHelper(this,field,iVar4,endValue,status);
  }
  return cal._4_4_;
}

Assistant:

int32_t
Calendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t result;
    switch (field) {
    case UCAL_DATE:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetMonthLength(cal->get(UCAL_EXTENDED_YEAR, status), cal->get(UCAL_MONTH, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_YEAR:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetYearLength(cal->get(UCAL_EXTENDED_YEAR, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
        // These fields all have fixed minima/maxima
        result = getMaximum(field);
        break;

    default:
        // For all other fields, do it the hard way....
        result = getActualHelper(field, getLeastMaximum(field), getMaximum(field),status);
        break;
    }
    return result;
}